

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_open_socket_inner(char *hostname,int portnumber,amqp_time_t deadline)

{
  int iVar1;
  uint in_ESI;
  char *in_RDI;
  int last_error;
  int sockfd;
  char portnumber_string [33];
  addrinfo *addr;
  addrinfo *address_list;
  addrinfo hint;
  int local_90;
  int local_8c;
  char local_88 [8];
  addrinfo *in_stack_ffffffffffffff80;
  amqp_time_t in_stack_ffffffffffffff88;
  addrinfo *local_60;
  addrinfo *local_58;
  addrinfo local_50;
  uint local_1c;
  char *local_18;
  int local_4;
  
  local_8c = -1;
  local_1c = in_ESI;
  local_18 = in_RDI;
  local_4 = amqp_os_socket_init();
  if (local_4 == 0) {
    memset(&local_50,0,0x30);
    local_50.ai_family = 0;
    local_50.ai_socktype = 1;
    local_50.ai_protocol = 6;
    sprintf(local_88,"%d",(ulong)local_1c);
    iVar1 = getaddrinfo(local_18,local_88,&local_50,&local_58);
    if (iVar1 == 0) {
      for (local_60 = local_58; local_90 = 0, local_60 != (addrinfo *)0x0;
          local_60 = local_60->ai_next) {
        local_8c = connect_socket(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
        if (-1 < local_8c) {
          local_90 = 0;
          break;
        }
        local_90 = local_8c;
        if (local_8c == -0xd) break;
      }
      freeaddrinfo(local_58);
      if ((local_90 == 0) && (local_8c != -1)) {
        local_4 = local_8c;
      }
      else {
        local_4 = local_90;
      }
    }
    else {
      local_4 = -5;
    }
  }
  return local_4;
}

Assistant:

int amqp_open_socket_inner(char const *hostname, int portnumber,
                           amqp_time_t deadline) {
  struct addrinfo hint;
  struct addrinfo *address_list;
  struct addrinfo *addr;
  char portnumber_string[33];
  int sockfd = -1;
  int last_error;

  last_error = amqp_os_socket_init();
  if (AMQP_STATUS_OK != last_error) {
    return last_error;
  }

  memset(&hint, 0, sizeof(hint));
  hint.ai_family = PF_UNSPEC; /* PF_INET or PF_INET6 */
  hint.ai_socktype = SOCK_STREAM;
  hint.ai_protocol = IPPROTO_TCP;

  (void)sprintf(portnumber_string, "%d", portnumber);

  last_error = getaddrinfo(hostname, portnumber_string, &hint, &address_list);
  if (0 != last_error) {
    return AMQP_STATUS_HOSTNAME_RESOLUTION_FAILED;
  }

  for (addr = address_list; addr; addr = addr->ai_next) {
    sockfd = connect_socket(addr, deadline);

    if (sockfd >= 0) {
      last_error = AMQP_STATUS_OK;
      break;
    } else if (sockfd == AMQP_STATUS_TIMEOUT) {
      last_error = sockfd;
      break;
    }
  }

  freeaddrinfo(address_list);
  if (last_error != AMQP_STATUS_OK || sockfd == -1) {
    return last_error;
  }
  return sockfd;
}